

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

int CCharmap::name_is_ucs2le_synonym(char *table_name)

{
  int iVar1;
  char *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  iVar1 = stricmp((char *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
                  in_stack_ffffffffffffffe8);
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    bVar2 = true;
    if (iVar1 != 0) {
      iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
      bVar2 = true;
      if (iVar1 != 0) {
        iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
        bVar2 = true;
        if (iVar1 != 0) {
          iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
          bVar2 = true;
          if (iVar1 != 0) {
            iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8)
            ;
            bVar2 = true;
            if (iVar1 != 0) {
              iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),
                              in_stack_ffffffffffffffe8);
              bVar2 = true;
              if (iVar1 != 0) {
                iVar1 = stricmp((char *)CONCAT17(1,in_stack_fffffffffffffff0),
                                in_stack_ffffffffffffffe8);
                bVar2 = iVar1 == 0;
              }
            }
          }
        }
      }
    }
  }
  return (int)bVar2;
}

Assistant:

static int name_is_ucs2le_synonym(const char *table_name)
    {
        return (stricmp(table_name, "utf-16le") == 0
                || stricmp(table_name, "utf16le") == 0
                || stricmp(table_name, "utf_16le") == 0
                || stricmp(table_name, "unicodel") == 0
                || stricmp(table_name, "unicode-l") == 0
                || stricmp(table_name, "unicode-le") == 0
                || stricmp(table_name, "ucs-2le") == 0
                || stricmp(table_name, "ucs2le") == 0);
    }